

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_by_extension(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  sVar3 = strlen(filename);
  iVar1 = strcmp(filename + (sVar3 - 10),".lb8.ugrid");
  if (iVar1 == 0) {
    uVar2 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x6ad,"ref_import_by_extension",(ulong)uVar2,"lb8_ugrid failed");
      return uVar2;
    }
  }
  else {
    iVar1 = strcmp(filename + (sVar3 - 9),".b8.ugrid");
    if (iVar1 == 0) {
      uVar2 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x6b1,"ref_import_by_extension",(ulong)uVar2,"b8_ugrid failed");
        return uVar2;
      }
    }
    else {
      iVar1 = strcmp(filename + (sVar3 - 0xb),".lb8l.ugrid");
      if (iVar1 == 0) {
        uVar2 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x6b5,"ref_import_by_extension",(ulong)uVar2,"lb8_ugrid failed");
          return uVar2;
        }
      }
      else {
        iVar1 = strcmp(filename + (sVar3 - 10),".b8l.ugrid");
        if (iVar1 == 0) {
          uVar2 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x6b9,"ref_import_by_extension",(ulong)uVar2,"b8_ugrid failed");
            return uVar2;
          }
        }
        else {
          iVar1 = strcmp(filename + (sVar3 - 0xc),".lb8.ugrid64");
          if (iVar1 == 0) {
            uVar2 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x6bd,"ref_import_by_extension",(ulong)uVar2,"lb8_ugrid failed");
              return uVar2;
            }
          }
          else {
            iVar1 = strcmp(filename + (sVar3 - 0xb),".b8.ugrid64");
            if (iVar1 == 0) {
              uVar2 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x6c1,"ref_import_by_extension",(ulong)uVar2,"b8_ugrid failed");
                return uVar2;
              }
            }
            else {
              iVar1 = strcmp(filename + (sVar3 - 9),".r8.ugrid");
              if (iVar1 == 0) {
                uVar2 = ref_import_r8_ugrid(ref_grid_ptr,ref_mpi,filename);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x6c4,"ref_import_by_extension",(ulong)uVar2,"r8_ugrid failed");
                  return uVar2;
                }
              }
              else {
                iVar1 = strcmp(filename + (sVar3 - 6),".ugrid");
                if (iVar1 == 0) {
                  uVar2 = ref_import_ugrid(ref_grid_ptr,ref_mpi,filename);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x6c6,"ref_import_by_extension",(ulong)uVar2,"ugrid failed");
                    return uVar2;
                  }
                }
                else {
                  iVar1 = strcmp(filename + (sVar3 - 4),".tri");
                  if (iVar1 == 0) {
                    uVar2 = ref_import_tri(ref_grid_ptr,ref_mpi,filename);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x6c8,"ref_import_by_extension",(ulong)uVar2,"tri failed");
                      return uVar2;
                    }
                  }
                  else {
                    iVar1 = strcmp(filename + (sVar3 - 5),".surf");
                    if (iVar1 == 0) {
                      uVar2 = ref_import_surf(ref_grid_ptr,ref_mpi,filename);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x6ca,"ref_import_by_extension",(ulong)uVar2,"surf failed");
                        return uVar2;
                      }
                    }
                    else {
                      iVar1 = strcmp(filename + (sVar3 - 6),".fgrid");
                      if (iVar1 == 0) {
                        uVar2 = ref_import_fgrid(ref_grid_ptr,ref_mpi,filename);
                        if (uVar2 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x6cc,"ref_import_by_extension",(ulong)uVar2,"fgrid failed");
                          return uVar2;
                        }
                      }
                      else {
                        iVar1 = strcmp(filename + (sVar3 - 4),".su2");
                        if (iVar1 == 0) {
                          uVar2 = ref_import_su2(ref_grid_ptr,ref_mpi,filename);
                          if (uVar2 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x6ce,"ref_import_by_extension",(ulong)uVar2,"su2 failed");
                            return uVar2;
                          }
                        }
                        else {
                          iVar1 = strcmp(filename + (sVar3 - 4),".msh");
                          if (iVar1 == 0) {
                            uVar2 = ref_import_msh(ref_grid_ptr,ref_mpi,filename);
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x6d0,"ref_import_by_extension",(ulong)uVar2,"msh failed");
                              return uVar2;
                            }
                          }
                          else {
                            iVar1 = strcmp(filename + (sVar3 - 5),".node");
                            if (iVar1 == 0) {
                              uVar2 = ref_import_tetgen_node(ref_grid_ptr,ref_mpi,filename);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x6d3,"ref_import_by_extension",(ulong)uVar2,
                                       "tetgen node failed");
                                return uVar2;
                              }
                            }
                            else {
                              iVar1 = strcmp(filename + (sVar3 - 6),".meshb");
                              if (iVar1 == 0) {
                                uVar2 = ref_import_meshb(ref_grid_ptr,ref_mpi,filename);
                                if (uVar2 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x6d5,"ref_import_by_extension",(ulong)uVar2,
                                         "meshb failed");
                                  return uVar2;
                                }
                              }
                              else {
                                iVar1 = strcmp(filename + (sVar3 - 5),".grid");
                                if (iVar1 == 0) {
                                  uVar2 = ref_import_i_like_cfd_grid(ref_grid_ptr,ref_mpi,filename);
                                  if (uVar2 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x6d8,"ref_import_by_extension",(ulong)uVar2,
                                           "I Like CFD grid failed");
                                    return uVar2;
                                  }
                                }
                                else {
                                  iVar1 = strcmp(filename + (sVar3 - 4),".avm");
                                  if (iVar1 != 0) {
                                    printf("%s: %d: %s %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x6dc,"input file name extension unknown",filename);
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x6de,"ref_import_by_extension",1,
                                           "unknown file extension");
                                    return 1;
                                  }
                                  uVar2 = ref_part_by_extension(ref_grid_ptr,ref_mpi,filename);
                                  if (uVar2 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x6da,"ref_import_by_extension",(ulong)uVar2,
                                           "part failed");
                                    return uVar2;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ref_grid_ptr_local._4_4_ = ref_grid_inward_boundary_orientation(*ref_grid_ptr);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x6e2,
           "ref_import_by_extension",(ulong)ref_grid_ptr_local._4_4_,"inward boundary orientation");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_import_by_extension(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_FALSE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_FALSE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".r8.ugrid") == 0) {
    RSS(ref_import_r8_ugrid(ref_grid_ptr, ref_mpi, filename),
        "r8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_import_ugrid(ref_grid_ptr, ref_mpi, filename), "ugrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_import_tri(ref_grid_ptr, ref_mpi, filename), "tri failed");
  } else if (strcmp(&filename[end_of_string - 5], ".surf") == 0) {
    RSS(ref_import_surf(ref_grid_ptr, ref_mpi, filename), "surf failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_import_fgrid(ref_grid_ptr, ref_mpi, filename), "fgrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_import_su2(ref_grid_ptr, ref_mpi, filename), "su2 failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_import_msh(ref_grid_ptr, ref_mpi, filename), "msh failed");
  } else if (strcmp(&filename[end_of_string - 5], ".node") == 0) {
    RSS(ref_import_tetgen_node(ref_grid_ptr, ref_mpi, filename),
        "tetgen node failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_import_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_import_i_like_cfd_grid(ref_grid_ptr, ref_mpi, filename),
        "I Like CFD grid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_by_extension(ref_grid_ptr, ref_mpi, filename), "part failed");
  } else {
    printf("%s: %d: %s %s\n", __FILE__, __LINE__,
           "input file name extension unknown", filename);
    RSS(REF_FAILURE, "unknown file extension");
  }

  RSS(ref_grid_inward_boundary_orientation(*ref_grid_ptr),
      "inward boundary orientation");

  return REF_SUCCESS;
}